

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O0

int __thiscall ncnn::MemoryData::load_model(MemoryData *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *in_stack_fffffffffffffee0;
  Mat *in_stack_fffffffffffffee8;
  Mat *this_00;
  size_t in_stack_fffffffffffffef0;
  Mat *in_stack_ffffffffffffff00;
  Mat local_b8;
  undefined1 local_60 [92];
  int local_4;
  
  if (*(int *)(in_RDI + 0xd8) == 0) {
    if (*(int *)(in_RDI + 0xd4) == 0) {
      if (*(int *)(in_RDI + 0xd0) == 0) {
        ncnn::Mat::create(in_stack_ffffffffffffff00,(int)((ulong)in_RDI >> 0x20),
                          in_stack_fffffffffffffef0,(Allocator *)in_stack_fffffffffffffee8);
      }
      else {
        in_stack_fffffffffffffee0 = (Mat *)&stack0xffffffffffffff00;
        (**(code **)(*in_RSI + 0x10))
                  (in_stack_fffffffffffffee0,in_RSI,*(undefined4 *)(in_RDI + 0xd0),1);
        ncnn::Mat::operator=(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
        ncnn::Mat::~Mat((Mat *)0x4b8a22);
      }
    }
    else {
      this_00 = &local_b8;
      (**(code **)(*in_RSI + 0x18))
                (this_00,in_RSI,*(undefined4 *)(in_RDI + 0xd0),*(undefined4 *)(in_RDI + 0xd4),1);
      ncnn::Mat::operator=(this_00,in_stack_fffffffffffffee0);
      ncnn::Mat::~Mat((Mat *)0x4b899f);
    }
  }
  else {
    (**(code **)(*in_RSI + 0x20))
              (local_60,in_RSI,*(undefined4 *)(in_RDI + 0xd0),*(undefined4 *)(in_RDI + 0xd4),
               *(undefined4 *)(in_RDI + 0xd8),1);
    ncnn::Mat::operator=(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    ncnn::Mat::~Mat((Mat *)0x4b8912);
  }
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffee0);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MemoryData::load_model(const ModelBin& mb)
{
    if (c != 0)
    {
        data = mb.load(w, h, c, 1);
    }
    else if (h != 0)
    {
        data = mb.load(w, h, 1);
    }
    else if (w != 0)
    {
        data = mb.load(w, 1);
    }
    else // 0 0 0
    {
        data.create(1);
    }
    if (data.empty())
        return -100;

    return 0;
}